

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArraySet.h
# Opt level: O0

bool __thiscall ArraySet::Contains(ArraySet *this,int x)

{
  size_type sVar1;
  const_reference pvVar2;
  bool local_31;
  int locationX;
  int x_local;
  ArraySet *this_local;
  
  if ((-1 < x) &&
     (sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->m_Lookup), (ulong)(long)x < sVar1)
     ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_Lookup,(long)x);
    local_31 = false;
    if (this->m_iBegin <= *pvVar2) {
      local_31 = *pvVar2 <= this->m_iEnd;
    }
    return local_31;
  }
  return false;
}

Assistant:

bool Contains(int const x) const {
        if (x < 0 || x >= m_Lookup.size()) return false;
        int const locationX(m_Lookup[x]);
        return locationX >= m_iBegin && locationX <= m_iEnd;
    }